

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall Hpipe::Source::Source(Source *this,char *file)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  fpos<__mbstate_t> local_260;
  fpos<__mbstate_t> local_250;
  long local_240;
  ssize_t size_data;
  long local_228;
  ifstream f;
  ssize_t size_prov;
  char *file_local;
  Source *this_local;
  
  this->prev = (Source *)0x0;
  sVar2 = strlen(file);
  sVar2 = sVar2 + 1;
  std::ifstream::ifstream(&local_228,file,8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (bVar1) {
    std::istream::seekg((long)&local_228,_S_beg);
    local_260 = (fpos<__mbstate_t>)std::istream::tellg();
    local_250 = std::fpos<__mbstate_t>::operator+(&local_260,1);
    local_240 = std::fpos::operator_cast_to_long((fpos *)&local_250);
    std::istream::seekg((long)&local_228,_S_beg);
    pcVar3 = (char *)malloc(sVar2 + local_240);
    this->rese = pcVar3;
    std::istream::read((char *)&local_228,(long)(this->rese + sVar2));
    this->rese[sVar2 + local_240 + -1] = '\0';
    this->data = this->rese + sVar2;
  }
  else {
    pcVar3 = (char *)malloc(sVar2);
    this->rese = pcVar3;
    this->data = (char *)0x0;
  }
  memcpy(this->rese,file,sVar2);
  this->provenance = this->rese;
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

Source::Source( const char *file ) : prev( 0 ) {
    ssize_t size_prov = strlen( file ) + 1;

    std::ifstream f( file );
    if ( f ) {
        f.seekg( 0, ios_base::end );
        ssize_t size_data = f.tellg() + ssize_t( 1 );
        f.seekg( 0, ios_base::beg );

        rese = (char *)malloc( size_prov + size_data );

        f.read( rese + size_prov, size_data - 1 );
        rese[ size_prov + size_data - 1 ] = 0;
        data = rese + size_prov;
    } else {
        rese = (char *)malloc( size_prov );
        data = 0;
    }

    // copy file -> provenance
    memcpy( rese, file, size_prov );
    provenance = rese;
}